

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

AssertionResult
testing::internal::HasOneFailure
          (char *param_1,char *param_2,char *param_3,TestPartResultArray *results,Type type,
          string *substr)

{
  TestPartResultArray *this;
  undefined1 auVar1 [8];
  char *__dest;
  TestPartResult *pTVar2;
  AssertionResult *pAVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_02;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar4
  ;
  AssertionResult *this_00;
  ostream *this_01;
  ostream *poVar5;
  undefined4 in_register_00000084;
  Type TVar6;
  char *pcVar7;
  int index;
  long lVar8;
  AssertionResult AVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  AssertionResult local_60;
  AssertionResult *local_50;
  undefined1 local_48 [8];
  String expected;
  Message msg;
  
  TVar6 = (Type)substr;
  this = (TestPartResultArray *)CONCAT44(in_register_00000084,type);
  pcVar7 = "1 non-fatal failure";
  if (TVar6 == kFatalFailure) {
    pcVar7 = "1 fatal failure";
  }
  lVar8 = (ulong)(TVar6 != kFatalFailure) * 4;
  local_50 = (AssertionResult *)param_1;
  __dest = (char *)operator_new__(lVar8 + 0x10);
  memcpy(__dest,pcVar7,lVar8 + 0xfU);
  __dest[lVar8 + 0xf] = '\0';
  local_48 = (undefined1  [8])__dest;
  expected.c_str_ = (char *)(lVar8 + 0xfU);
  Message::Message((Message *)&expected.length_);
  if ((*(long *)(this + 8) - *(long *)this & 0x3fffffffc0U) == 0x40) {
    pTVar2 = TestPartResultArray::GetTestPartResult(this,0);
    if (pTVar2->type_ == TVar6) {
      pcVar7 = strstr((pTVar2->message_).c_str_,(in_stack_00000008->_M_dataplus)._M_p);
      this_00 = local_50;
      if (pcVar7 != (char *)0x0) {
        local_50->success_ = true;
        (local_50->message_).ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        sVar4.ptr_ = extraout_RDX;
        goto LAB_0011f6ef;
      }
      local_60.success_ = false;
      local_60.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar3 = AssertionResult::operator<<(&local_60,(char (*) [11])0x136a87);
      pAVar3 = AssertionResult::operator<<(pAVar3,(String *)local_48);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [14])" containing \"");
      pAVar3 = AssertionResult::operator<<(pAVar3,in_stack_00000008);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [3])0x137286);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [11])"  Actual:\n");
      pAVar3 = AssertionResult::operator<<(pAVar3,pTVar2);
      AssertionResult::AssertionResult(this_00,pAVar3);
    }
    else {
      local_60.success_ = false;
      local_60.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar3 = AssertionResult::operator<<(&local_60,(char (*) [11])0x136a87);
      this_00 = local_50;
      pAVar3 = AssertionResult::operator<<(pAVar3,(String *)local_48);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [2])0x1371d3);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [11])"  Actual:\n");
      pAVar3 = AssertionResult::operator<<(pAVar3,pTVar2);
      AssertionResult::AssertionResult(this_00,pAVar3);
    }
  }
  else {
    poVar5 = (ostream *)(expected.length_ + 0x10);
    if (expected.length_ == 0) {
      poVar5 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Expected: ",10);
    auVar1 = local_48;
    poVar5 = (ostream *)(expected.length_ + 0x10);
    if (expected.length_ == 0) {
      poVar5 = (ostream *)0x0;
    }
    if (local_48 == (undefined1  [8])0x0) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(null)",6);
    }
    else if (expected.c_str_ != (char *)0x0) {
      pcVar7 = (char *)0x0;
      do {
        if (*(char *)((long)auVar1 + (long)pcVar7) == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\\0",2);
        }
        else {
          local_60.success_ = (bool)*(char *)((long)auVar1 + (long)pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_60.success_,1);
        }
        pcVar7 = pcVar7 + 1;
      } while (pcVar7 != expected.c_str_);
    }
    poVar5 = (ostream *)(expected.length_ + 0x10);
    if (expected.length_ == 0) {
      poVar5 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    poVar5 = (ostream *)(expected.length_ + 0x10);
    if (expected.length_ == 0) {
      poVar5 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  Actual: ",10);
    this_01 = (ostream *)(expected.length_ + 0x10);
    if (expected.length_ == 0) {
      this_01 = (ostream *)0x0;
    }
    std::ostream::operator<<(this_01,(int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 6));
    this_00 = local_50;
    poVar5 = (ostream *)(expected.length_ + 0x10);
    if (expected.length_ == 0) {
      poVar5 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," failures",9);
    if (0 < (int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 6)) {
      index = 0;
      do {
        poVar5 = (ostream *)(expected.length_ + 0x10);
        if (expected.length_ == 0) {
          poVar5 = (ostream *)0x0;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        pTVar2 = TestPartResultArray::GetTestPartResult(this,index);
        poVar5 = (ostream *)(expected.length_ + 0x10);
        if (expected.length_ == 0) {
          poVar5 = (ostream *)0x0;
        }
        testing::operator<<(poVar5,pTVar2);
        index = index + 1;
      } while (index < (int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 6));
    }
    local_60.success_ = false;
    local_60.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pAVar3 = AssertionResult::operator<<(&local_60,(Message *)&expected.length_);
    AssertionResult::AssertionResult(this_00,pAVar3);
  }
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_60.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  sVar4.ptr_ = extraout_RDX_00;
LAB_0011f6ef:
  if (expected.length_ != 0) {
    (**(code **)(*(long *)expected.length_ + 8))();
    expected.length_ = 0;
    sVar4.ptr_ = extraout_RDX_01;
  }
  if (local_48 != (undefined1  [8])0x0) {
    operator_delete__((void *)local_48);
    sVar4.ptr_ = extraout_RDX_02;
  }
  AVar9.message_.ptr_ = sVar4.ptr_;
  AVar9._0_8_ = this_00;
  return AVar9;
}

Assistant:

AssertionResult HasOneFailure(const char* /* results_expr */,
                              const char* /* type_expr */,
                              const char* /* substr_expr */,
                              const TestPartResultArray& results,
                              TestPartResult::Type type,
                              const string& substr) {
  const String expected(type == TestPartResult::kFatalFailure ?
                        "1 fatal failure" :
                        "1 non-fatal failure");
  Message msg;
  if (results.size() != 1) {
    msg << "Expected: " << expected << "\n"
        << "  Actual: " << results.size() << " failures";
    for (int i = 0; i < results.size(); i++) {
      msg << "\n" << results.GetTestPartResult(i);
    }
    return AssertionFailure() << msg;
  }

  const TestPartResult& r = results.GetTestPartResult(0);
  if (r.type() != type) {
    return AssertionFailure() << "Expected: " << expected << "\n"
                              << "  Actual:\n"
                              << r;
  }

  if (strstr(r.message(), substr.c_str()) == NULL) {
    return AssertionFailure() << "Expected: " << expected << " containing \""
                              << substr << "\"\n"
                              << "  Actual:\n"
                              << r;
  }

  return AssertionSuccess();
}